

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_nminmax_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0,uint32_t op1,
          GLSLstd450 op)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  char *local_208;
  TypedID<(spirv_cross::Types)0> local_1b0;
  TypedID<(spirv_cross::Types)0> local_1ac;
  TypedID<(spirv_cross::Types)0> local_1a8;
  TypedID<(spirv_cross::Types)0> local_1a4;
  uint32_t local_1a0;
  uint32_t local_19c;
  uint32_t mixed_first_id;
  uint32_t tmp_id;
  uint32_t right_nan_id;
  uint32_t left_nan_id;
  uint32_t btype_id;
  undefined1 local_180 [8];
  SPIRType btype;
  uint32_t *ids;
  GLSLstd450 op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  op1_local = id;
  op0_local = result_type;
  _id_local = this;
  btype.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)
       ::std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::operator[](&this->extra_sub_expressions,&op1_local);
  if (*(mapped_type *)&(btype.member_name_cache._M_h._M_single_bucket)->_M_nxt == 0) {
    uVar2 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,5);
    *(uint32_t *)&(btype.member_name_cache._M_h._M_single_bucket)->_M_nxt = uVar2;
    pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,op0_local);
    SPIRType::SPIRType((SPIRType *)local_180,pSVar3);
    btype.super_IVariant._vptr_IVariant._4_4_ = 2;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              (&this->super_Compiler,
               *(uint32_t *)&(btype.member_name_cache._M_h._M_single_bucket)->_M_nxt,
               (SPIRType *)local_180);
    SPIRType::~SPIRType((SPIRType *)local_180);
  }
  right_nan_id = *(uint32_t *)&(btype.member_name_cache._M_h._M_single_bucket)->_M_nxt;
  tmp_id = *(int *)&(btype.member_name_cache._M_h._M_single_bucket)->_M_nxt + 1;
  mixed_first_id = *(int *)&(btype.member_name_cache._M_h._M_single_bucket)->_M_nxt + 2;
  local_19c = *(int *)&(btype.member_name_cache._M_h._M_single_bucket)->_M_nxt + 3;
  local_1a0 = *(int *)&(btype.member_name_cache._M_h._M_single_bucket)->_M_nxt + 4;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_1a4,op1_local);
  pmVar4 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&local_1a4);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_1a8,local_19c);
  pmVar5 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&local_1a8);
  Meta::operator=(pmVar5,pmVar4);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_1ac,op1_local);
  pmVar4 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&local_1ac);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_1b0,local_1a0);
  pmVar5 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&local_1b0);
  Meta::operator=(pmVar5,pmVar4);
  bVar1 = is_legacy(this);
  if (bVar1) {
    pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
    if (pSVar3->vecsize < 2) {
      emit_binary_op(this,right_nan_id,tmp_id,op0,op0,"!=");
      emit_binary_op(this,right_nan_id,mixed_first_id,op1,op1,"!=");
    }
    else {
      emit_binary_func_op(this,right_nan_id,tmp_id,op0,op0,"notEqual");
      emit_binary_func_op(this,right_nan_id,mixed_first_id,op1,op1,"notEqual");
    }
  }
  else {
    emit_unary_func_op(this,right_nan_id,tmp_id,op0,"isnan");
    emit_unary_func_op(this,right_nan_id,mixed_first_id,op1,"isnan");
  }
  if (op == GLSLstd450NMin) {
    local_208 = "precise::min";
  }
  else {
    local_208 = "precise::max";
  }
  local_208 = local_208 + 9;
  emit_binary_func_op(this,op0_local,local_19c,op0,op1,local_208);
  emit_mix_op(this,op0_local,local_1a0,local_19c,op1,tmp_id);
  emit_mix_op(this,op0_local,op1_local,local_1a0,op0,mixed_first_id);
  return;
}

Assistant:

void CompilerGLSL::emit_nminmax_op(uint32_t result_type, uint32_t id, uint32_t op0, uint32_t op1, GLSLstd450 op)
{
	// Need to emulate this call.
	uint32_t &ids = extra_sub_expressions[id];
	if (!ids)
	{
		ids = ir.increase_bound_by(5);
		auto btype = get<SPIRType>(result_type);
		btype.basetype = SPIRType::Boolean;
		set<SPIRType>(ids, btype);
	}

	uint32_t btype_id = ids + 0;
	uint32_t left_nan_id = ids + 1;
	uint32_t right_nan_id = ids + 2;
	uint32_t tmp_id = ids + 3;
	uint32_t mixed_first_id = ids + 4;

	// Inherit precision qualifiers.
	ir.meta[tmp_id] = ir.meta[id];
	ir.meta[mixed_first_id] = ir.meta[id];

	if (!is_legacy())
	{
		emit_unary_func_op(btype_id, left_nan_id, op0, "isnan");
		emit_unary_func_op(btype_id, right_nan_id, op1, "isnan");
	}
	else if (expression_type(op0).vecsize > 1)
	{
		// If the number doesn't equal itself, it must be NaN
		emit_binary_func_op(btype_id, left_nan_id, op0, op0, "notEqual");
		emit_binary_func_op(btype_id, right_nan_id, op1, op1, "notEqual");
	}
	else
	{
		emit_binary_op(btype_id, left_nan_id, op0, op0, "!=");
		emit_binary_op(btype_id, right_nan_id, op1, op1, "!=");
	}
	emit_binary_func_op(result_type, tmp_id, op0, op1, op == GLSLstd450NMin ? "min" : "max");
	emit_mix_op(result_type, mixed_first_id, tmp_id, op1, left_nan_id);
	emit_mix_op(result_type, id, mixed_first_id, op0, right_nan_id);
}